

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O2

void __thiscall jrtplib::RTPPacketBuilder::Destroy(RTPPacketBuilder *this)

{
  RTPMemoryManager *in_RDX;
  
  if (this->init == true) {
    RTPDeleteByteArray((jrtplib *)this->buffer,(uint8_t *)(this->super_RTPMemoryObject).mgr,in_RDX);
    this->init = false;
  }
  return;
}

Assistant:

void RTPPacketBuilder::Destroy()
{
	if (!init)
		return;
	RTPDeleteByteArray(buffer,GetMemoryManager());
	init = false;
}